

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void free_dfg(CManager_conflict cm,void *vdfg)

{
  void *in_RSI;
  int i;
  EVdfg dfg;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *(int *)((long)in_RSI + 0x10); iVar1 = iVar1 + 1) {
    if (*(long *)(*(long *)((long)in_RSI + 0x18) + (long)iVar1 * 8) != 0) {
      free(*(void **)(*(long *)((long)in_RSI + 0x18) + (long)iVar1 * 8));
    }
  }
  if (*(long *)((long)in_RSI + 0x18) != 0) {
    free(*(void **)((long)in_RSI + 0x18));
  }
  if (*(long *)((long)in_RSI + 0x30) != 0) {
    free_dfg_state((EVdfg_configuration)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  if (*(long *)((long)in_RSI + 0x38) != 0) {
    free_dfg_state((EVdfg_configuration)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  free(in_RSI);
  return;
}

Assistant:

static void
free_dfg(CManager cm, void *vdfg)
{
    EVdfg dfg = vdfg;
    int i;
    for (i=0; i < dfg->stone_count; i++) {
	if (dfg->stones[i]) free(dfg->stones[i]);
    }
    if (dfg->stones) free(dfg->stones);
    if (dfg->deployed_state) free_dfg_state(dfg->deployed_state);
    if (dfg->working_state) free_dfg_state(dfg->working_state);
    free(dfg);
}